

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O3

int dsSync(int block)

{
  int iVar1;
  void *pvVar2;
  char *fmt;
  
  pthread_once(&keyOnce,makeKey);
  pvVar2 = pthread_getspecific(key);
  if (pvVar2 == (void *)0x0) {
    fmt = "%s(): Can\'t get active crate.\n";
  }
  else {
    iVar1 = msync(*(void **)((long)pvVar2 + 0x10),*(size_t *)((long)pvVar2 + 0x20),
                  (uint)(block != 0) * 3 + 1);
    if (-1 < iVar1) {
      return 0;
    }
    fmt = "%s(): Can\'t synchronize crate.\n";
  }
  dsRunLogCallback(fmt,"dsSync");
  return -1;
}

Assistant:

int
dsSync(int block)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return -1;
	}

	int flags = block ? MS_SYNC : MS_ASYNC;

	if (msync(crate->map.ptr, crate->map.length, flags) < 0) {
		dsLog("Can't synchronize crate.\n");
		return -1;
	}

	return 0;
}